

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O1

int * __thiscall
TTD::UnorderedArrayList<int,_32UL>::NextOpenEntry(UnorderedArrayList<int,_32UL> *this)

{
  int *piVar1;
  int *piVar2;
  
  piVar1 = (this->m_inlineHeadBlock).CurrPos;
  piVar2 = (this->m_inlineHeadBlock).EndPos;
  if ((piVar1 <= piVar2) &&
     ((ulong)((long)piVar1 - (long)(this->m_inlineHeadBlock).BlockData) < 0x84)) {
    if (piVar1 == piVar2) {
      AddArrayLink(this);
    }
    piVar1 = (this->m_inlineHeadBlock).CurrPos;
    (this->m_inlineHeadBlock).CurrPos = piVar1 + 1;
    return piVar1;
  }
  TTDAbort_unrecoverable_error("We are off the end of the array");
}

Assistant:

T* NextOpenEntry()
        {
            TTDAssert(this->m_inlineHeadBlock.CurrPos <= this->m_inlineHeadBlock.EndPos, "We are off the end of the array");
            TTDAssert((((byte*)this->m_inlineHeadBlock.CurrPos) - ((byte*)this->m_inlineHeadBlock.BlockData)) / sizeof(T) <= allocSize, "We are off the end of the array");

            if (this->m_inlineHeadBlock.CurrPos == this->m_inlineHeadBlock.EndPos)
            {
                this->AddArrayLink();
            }

            T* entry = this->m_inlineHeadBlock.CurrPos;
            this->m_inlineHeadBlock.CurrPos++;

            return entry;
        }